

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::flags_to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,Bitset *flags)

{
  bool bVar1;
  bool bVar2;
  SPIREntryPoint *pSVar3;
  char *pcVar4;
  bool bVar5;
  bool implied_ihighp;
  bool implied_fhighp;
  bool implied_imediump;
  bool implied_fmediump;
  SPIREntryPoint *execution;
  bool type_supports_precision;
  allocator local_29;
  Bitset *local_28;
  Bitset *flags_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *qual;
  
  local_28 = flags;
  flags_local = (Bitset *)type;
  type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  bVar2 = Bitset::get(flags,0x14eb);
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"restrict ",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    bVar2 = type_is_floating_point((SPIRType *)flags_local);
    if (((bVar2) && (bVar2 = Bitset::get(local_28,0x2a), bVar2)) &&
       (((this->backend).support_precise_qualifier & 1U) != 0)) {
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"precise ");
    }
    bVar2 = true;
    if ((((int)(flags_local->higher)._M_h._M_bucket_count != 0xd) &&
        (bVar2 = true, (int)(flags_local->higher)._M_h._M_bucket_count != 7)) &&
       ((bVar2 = true, (int)(flags_local->higher)._M_h._M_bucket_count != 8 &&
        ((bVar2 = true, (int)(flags_local->higher)._M_h._M_bucket_count != 0x10 &&
         (bVar2 = true, (int)(flags_local->higher)._M_h._M_bucket_count != 0x11)))))) {
      bVar2 = (int)(flags_local->higher)._M_h._M_bucket_count == 0x12;
    }
    if (bVar2) {
      if (((this->options).es & 1U) == 0) {
        if ((((this->backend).allow_precision_qualifiers & 1U) != 0) &&
           (bVar2 = Bitset::get(local_28,0), bVar2)) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"mediump ");
        }
      }
      else {
        pSVar3 = Compiler::get_entry_point(&this->super_Compiler);
        if (((int)(flags_local->higher)._M_h._M_bucket_count == 8) &&
           (bVar2 = is_legacy_es(this), bVar2)) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"lowp ");
        }
        else {
          bVar2 = Bitset::get(local_28,0);
          if (bVar2) {
            bVar2 = false;
            if (((int)(flags_local->higher)._M_h._M_bucket_count == 0xd) &&
               (bVar2 = false, (this->options).fragment.default_float_precision == Mediump)) {
              bVar2 = pSVar3->model == ExecutionModelFragment;
            }
            if ((((int)(flags_local->higher)._M_h._M_bucket_count == 7) ||
                (bVar5 = false, (int)(flags_local->higher)._M_h._M_bucket_count == 8)) &&
               (bVar5 = false, (this->options).fragment.default_int_precision == Mediump)) {
              bVar5 = pSVar3->model == ExecutionModelFragment;
            }
            bVar1 = true;
            if (!bVar2) {
              bVar1 = bVar5;
            }
            pcVar4 = "mediump ";
            if (bVar1) {
              pcVar4 = "";
            }
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar4);
          }
          else {
            bVar2 = false;
            if (((int)(flags_local->higher)._M_h._M_bucket_count == 0xd) &&
               (((this->options).fragment.default_float_precision != Highp ||
                (bVar2 = true, pSVar3->model != ExecutionModelFragment)))) {
              bVar2 = pSVar3->model != ExecutionModelFragment;
            }
            if ((((int)(flags_local->higher)._M_h._M_bucket_count == 7) ||
                (bVar5 = false, (int)(flags_local->higher)._M_h._M_bucket_count == 8)) &&
               (((this->options).fragment.default_int_precision != Highp ||
                (bVar5 = true, pSVar3->model != ExecutionModelFragment)))) {
              bVar5 = pSVar3->model != ExecutionModelFragment;
            }
            bVar1 = true;
            if (!bVar2) {
              bVar1 = bVar5;
            }
            pcVar4 = "highp ";
            if (bVar1) {
              pcVar4 = "";
            }
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar4);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::flags_to_qualifiers_glsl(const SPIRType &type, const Bitset &flags)
{
	// GL_EXT_buffer_reference variables can be marked as restrict.
	if (flags.get(DecorationRestrictPointerEXT))
		return "restrict ";

	string qual;

	if (type_is_floating_point(type) && flags.get(DecorationNoContraction) && backend.support_precise_qualifier)
		qual = "precise ";

	// Structs do not have precision qualifiers, neither do doubles (desktop only anyways, so no mediump/highp).
	bool type_supports_precision =
			type.basetype == SPIRType::Float || type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt ||
			type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
			type.basetype == SPIRType::Sampler;

	if (!type_supports_precision)
		return qual;

	if (options.es)
	{
		auto &execution = get_entry_point();

		if (type.basetype == SPIRType::UInt && is_legacy_es())
		{
			// HACK: This is a bool. See comment in type_to_glsl().
			qual += "lowp ";
		}
		else if (flags.get(DecorationRelaxedPrecision))
		{
			bool implied_fmediump = type.basetype == SPIRType::Float &&
			                        options.fragment.default_float_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			bool implied_imediump = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                        options.fragment.default_int_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			qual += (implied_fmediump || implied_imediump) ? "" : "mediump ";
		}
		else
		{
			bool implied_fhighp =
			    type.basetype == SPIRType::Float && ((options.fragment.default_float_precision == Options::Highp &&
			                                          execution.model == ExecutionModelFragment) ||
			                                         (execution.model != ExecutionModelFragment));

			bool implied_ihighp = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                      ((options.fragment.default_int_precision == Options::Highp &&
			                        execution.model == ExecutionModelFragment) ||
			                       (execution.model != ExecutionModelFragment));

			qual += (implied_fhighp || implied_ihighp) ? "" : "highp ";
		}
	}
	else if (backend.allow_precision_qualifiers)
	{
		// Vulkan GLSL supports precision qualifiers, even in desktop profiles, which is convenient.
		// The default is highp however, so only emit mediump in the rare case that a shader has these.
		if (flags.get(DecorationRelaxedPrecision))
			qual += "mediump ";
	}

	return qual;
}